

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPHINFToolInfo(ndicapi *pol,char *information)

{
  int local_24;
  char *pcStack_20;
  int i;
  char *dp;
  char *information_local;
  ndicapi *pol_local;
  
  pcStack_20 = pol->PhinfBasic;
  for (local_24 = 0; local_24 < 0x1f; local_24 = local_24 + 1) {
    information[local_24] = *pcStack_20;
    pcStack_20 = pcStack_20 + 1;
  }
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFToolInfo(ndicapi* pol, char information[31])
{
  char* dp;
  int i;

  dp = pol->PhinfBasic;

  for (i = 0; i < 31; i++)
  {
    information[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}